

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O2

void __thiscall StunMsgCxx_ErrorResponse_Test::TestBody(StunMsgCxx_ErrorResponse_Test *this)

{
  stun_attr_hdr *attr;
  uint16_t uVar1;
  stun_msg_hdr *expected;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  char *in_R9;
  size_t i_1;
  size_t n;
  bool bVar4;
  self_type sVar5;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  error_code errcode;
  iterator i;
  AssertHelper local_80;
  uint16_t unknown [3];
  undefined1 local_72 [2];
  message message;
  char reason_phrase [18];
  uint8_t tsx_id [12];
  
  builtin_strncpy(reason_phrase,"Unknown Attribute",0x12);
  tsx_id[0] = 'x';
  tsx_id[1] = 0xad;
  tsx_id[2] = '4';
  tsx_id[3] = '3';
  tsx_id[4] = 0xc6;
  tsx_id[5] = 0xad;
  tsx_id[6] = 'r';
  tsx_id[7] = 0xc0;
  tsx_id[8] = ')';
  tsx_id[9] = 0xda;
  tsx_id[10] = 'A';
  tsx_id[0xb] = '.';
  unknown[2] = 0x802c;
  unknown[0] = 0x1a;
  unknown[1] = 0x1b;
  stun::base_message<std::allocator<unsigned_char>_>::base_message(&message,0x111,tsx_id);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 1;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)reason_phrase;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::errcode>
            (&message,(errcode *)&gtest_ar);
  expected = (stun_msg_hdr *)unknown;
  i.attr_.attr_hdr_ = (stun_attr_hdr *)local_72;
  i.attr_.msg_hdr_ = expected;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::unknown>
            (&message,(unknown *)&i);
  i.attr_.msg_hdr_ = (stun_msg_hdr *)0x3c;
  errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ =
       (stun_msg_hdr *)
       stun_msg_len((stun_msg_hdr *)
                    message.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","message.size()",(unsigned_long *)&i,
             (unsigned_long *)&errcode);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&i);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&errcode,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1dd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&errcode,(Message *)&i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&errcode);
    pAVar2 = (AssertionResult *)&i;
LAB_0012ef34:
    this_00 = &gtest_ar.message_;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pAVar2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    anon_unknown.dwarf_19b63::IsEqual
              ((anon_unknown_dwarf_19b63 *)&i,&DAT_00147500,
               message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x3c);
    if ((char)i.attr_.msg_hdr_ == '\0') {
      testing::Message::Message((Message *)&errcode);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&i,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1df,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&errcode);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&errcode);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&i.attr_.attr_hdr_);
    i.attr_.msg_hdr_._0_4_ = 0x111;
    uVar1 = stun_msg_type((stun_msg_hdr *)
                          message.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ =
         (stun_msg_hdr *)
         CONCAT62(errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_._2_6_,uVar1);
    testing::internal::
    CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((internal *)&gtest_ar,"stun::message::binding_error_response","message.type()",
               (type *)&i,(unsigned_short *)&errcode);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&i);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&errcode,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&errcode,(Message *)&i);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&errcode);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&i);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    i = stun::base_message<std::allocator<unsigned_char>_>::begin(&message);
    this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&errcode.super_attribute_base<_stun_attr_errcode>.attr_;
    errcode.super_attribute_base<_stun_attr_errcode>.attr_ = (_stun_attr_errcode *)0x0;
    bVar4 = i.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ =
         (stun_msg_hdr *)
         CONCAT71(errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_._1_7_,!bVar4);
    if (bVar4) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&errcode,(AssertionResult *)"message.end() != i",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e6,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      pAVar2 = &gtest_ar_4;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_00);
      errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ =
           (stun_msg_hdr *)
           CONCAT44(errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_._4_4_,9);
      uVar1 = stun_attr_type(i.attr_.attr_hdr_);
      gtest_ar_4._0_2_ = uVar1;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)&gtest_ar,"type::error_code","i->type()",(attribute_type *)&errcode,
                 (unsigned_short *)&gtest_ar_4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&errcode);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1e7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&errcode);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&errcode);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ = i.attr_.msg_hdr_;
      errcode.super_attribute_base<_stun_attr_errcode>.attr_ =
           (_stun_attr_errcode *)i.attr_.attr_hdr_;
      gtest_ar_4._0_4_ = 0x1a4;
      local_e0._0_4_ = stun_attr_errcode_status((stun_attr_errcode *)i.attr_.attr_hdr_);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"420","errcode.status_code()",(int *)&gtest_ar_4,
                 (int *)local_e0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_4);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ea,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar_4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_4);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      stun::attribute::decoding_bits::errcode::reason_phrase_abi_cxx11_
                ((string *)&gtest_ar,&errcode);
      testing::internal::CmpHelperEQ<char[18],std::__cxx11::string>
                ((internal *)&gtest_ar_4,"reason_phrase","errcode.reason_phrase()",&reason_phrase,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_4.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_4.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1eb,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_4.message_);
      sVar5 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar4 = sVar5.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
      gtest_ar_4.success_ = !bVar4;
      if (bVar4) {
        testing::Message::Message((Message *)local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_4,
                   (AssertionResult *)"message.end() != ++i","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ed,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)local_e0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_4.message_);
        gtest_ar_4._0_4_ = 10;
        uVar1 = stun_attr_type(i.attr_.attr_hdr_);
        local_e0._0_2_ = uVar1;
        testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                  ((internal *)&gtest_ar,"type::unknown_attributes","i->type()",
                   (attribute_type *)&gtest_ar_4,(unsigned_short *)local_e0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_4);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1ee,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_e0,(Message *)&gtest_ar_4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_4);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        attr = i.attr_.attr_hdr_;
        gtest_ar_4.success_ = true;
        gtest_ar_4._1_7_ = 0;
        local_e0 = (undefined1  [8])stun_attr_unknown_count((stun_attr_unknown *)i.attr_.attr_hdr_);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"(sizeof(unknown)/sizeof(unknown[0]))","unk.size()",
                   (unsigned_long *)&gtest_ar_4,(unsigned_long *)local_e0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_4);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1f1,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_e0,(Message *)&gtest_ar_4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
          pAVar2 = &gtest_ar_4;
          goto LAB_0012ef34;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        for (n = 0; n != 3; n = n + 1) {
          uVar1 = stun_attr_unknown_get((stun_attr_unknown *)attr,n);
          gtest_ar_4._0_2_ = uVar1;
          testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                    ((internal *)&gtest_ar,"unknown[i]","unk[i]",&expected->type,
                     (unsigned_short *)&gtest_ar_4);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_4);
            pcVar3 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,499,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_e0,(Message *)&gtest_ar_4);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_4);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          expected = (stun_msg_hdr *)&expected->length;
        }
        sVar5 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
        this_00 = &gtest_ar_4.message_;
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar4 = sVar5.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
        gtest_ar_4.success_ = bVar4;
        if (bVar4) goto LAB_0012f52e;
        testing::Message::Message((Message *)local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_4,
                   (AssertionResult *)"message.end() == ++i","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1f6,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)local_e0);
      }
      this_00 = &gtest_ar_4.message_;
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      std::__cxx11::string::~string((string *)&gtest_ar);
      pAVar2 = (AssertionResult *)local_e0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pAVar2);
  }
LAB_0012f52e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&message);
  return;
}

Assistant:

TEST(StunMsgCxx, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  stun::message message(stun::message::binding_error_response, tsx_id);
  message << stun::attribute::error_code(420, reason_phrase)
          << stun::attribute::unknown_attributes(unknown, ARRAY_SIZE(unknown));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_error_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::error_code, i->type());
  stun::attribute::decoding::error_code errcode =
    i->to<type::error_code>();
  EXPECT_EQ(420, errcode.status_code());
  EXPECT_EQ(reason_phrase, errcode.reason_phrase());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::unknown_attributes, i->type());
  stun::attribute::decoding::unknown_attributes unk =
    i->to<type::unknown_attributes>();
  ASSERT_EQ(ARRAY_SIZE(unknown), unk.size());
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], unk[i]);
  }

  ASSERT_TRUE(message.end() == ++i);
}